

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O1

void __thiscall
covenant::DFA_impl::distinctTable<bool>::distinctTable
          (distinctTable<bool> *this,uint n,bool init_val)

{
  pointer pvVar1;
  uint j;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  _Bvector_base<std::allocator<bool>_> *this_00;
  ulong __n;
  bool local_5a;
  allocator_type local_59;
  vector<bool,_std::allocator<bool>_> local_58;
  
  __n = (ulong)n;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&this->M,__n,(allocator_type *)&local_58);
  if (n != 0) {
    lVar4 = 0;
    do {
      local_5a = false;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_58,__n,&local_5a,&local_59);
      this_00 = (_Bvector_base<std::allocator<bool>_> *)
                ((long)&(((this->M).
                          super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Bvector_base<std::allocator<bool>_>)._M_impl + lVar4);
      std::_Bvector_base<std::allocator<bool>_>::_M_deallocate(this_00);
      (this_00->_M_impl).super__Bvector_impl_data._M_end_of_storage =
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
      (this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
      *(ulong *)&(this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                 _M_offset =
           CONCAT44(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_,
                    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
      (this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
      (this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_offset;
      *(undefined4 *)
       &(this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base.field_0xc =
           local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._12_4_;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      lVar4 = lVar4 + 0x28;
    } while (__n * 0x28 != lVar4);
    pvVar1 = (this->M).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = 0;
    do {
      lVar4 = *(long *)&pvVar1[uVar3].super__Bvector_base<std::allocator<bool>_>._M_impl;
      uVar2 = 0;
      do {
        uVar5 = uVar2 >> 6;
        uVar6 = 1L << ((byte)uVar2 & 0x3f);
        if (init_val) {
          uVar6 = uVar6 | *(ulong *)(lVar4 + uVar5 * 8);
        }
        else {
          uVar6 = ~uVar6 & *(ulong *)(lVar4 + uVar5 * 8);
        }
        *(ulong *)(lVar4 + uVar5 * 8) = uVar6;
        uVar2 = uVar2 + 1;
      } while (__n != uVar2);
      uVar3 = uVar3 + 1;
    } while (uVar3 != __n);
  }
  return;
}

Assistant:

distinctTable(unsigned n, V init_val): M(n) 
       {
         for (unsigned i = 0; i < n; ++i)
           M[i] = vector<V>(n);
         
         for (unsigned i = 0; i < n; ++i)
         {
           for (unsigned j = 0; j < n; ++j)
             M[i][j]=init_val;
         }
       }